

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

char * Curl_checkheaders(connectdata *conn,char *thisheader)

{
  int iVar1;
  size_t max;
  curl_slist *pcVar2;
  
  max = strlen(thisheader);
  pcVar2 = (conn->data->set).headers;
  while( true ) {
    if (pcVar2 == (curl_slist *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Curl_raw_nequal(pcVar2->data,thisheader,max);
    if (iVar1 != 0) break;
    pcVar2 = pcVar2->next;
  }
  return pcVar2->data;
}

Assistant:

char *Curl_checkheaders(const struct connectdata *conn,
                        const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct SessionHandle *data = conn->data;

  for(head = data->set.headers;head; head=head->next) {
    if(Curl_raw_nequal(head->data, thisheader, thislen))
      return head->data;
  }
  return NULL;
}